

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

bool __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::insert_internal
          (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k,value_type v)

{
  _Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
  *k_00;
  ulong uVar1;
  _Head_base<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
  ptr_;
  _Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  _Var2;
  byte bVar3;
  int iVar4;
  uintptr_t uVar5;
  ulong uVar6;
  basic_node_ptr<unodb::detail::node_header> bVar7;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this_00;
  bool bVar8;
  value_view v_00;
  value_view v_01;
  value_view v_02;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *local_98;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *leaf_1;
  uint shared_prefix_len;
  undefined1 local_80 [8];
  value_type v_local;
  basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db>
  new_leaf;
  basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db> leaf;
  art_key_type k_local;
  art_key_type remaining_key;
  node_ptr *node;
  tree_depth_type depth;
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  v_02._M_extent._M_extent_value = (size_t)v._M_ptr;
  bVar7.tagged_ptr = (this->root).tagged_ptr;
  local_80 = (undefined1  [8])v_02._M_extent._M_extent_value;
  leaf._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
  ._M_head_impl = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)k.field_0;
  if (bVar7.tagged_ptr == 0) {
    v_02._M_ptr = (pointer)k.field_0;
    detail::
    make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db>
              ((art_key_type)
               &new_leaf._M_t.
                super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
               ,v_02,(db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                     v_local._M_ptr);
    _Var2 = leaf._M_t.
            super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
            .
            super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ;
    leaf._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )(basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            )0x0;
    uVar5 = detail::basic_node_ptr<unodb::detail::node_header>::tag_ptr
                      ((node_header *)
                       _Var2.
                       super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                       ._M_head_impl.db,LEAF);
    (this->root).tagged_ptr = uVar5;
LAB_0015d004:
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)&new_leaf._M_t.
                      super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      .
                      super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
                 );
LAB_0015d009:
    bVar8 = true;
  }
  else {
    node._4_4_ = 0;
    k_local.field_0 = k.field_0;
    remaining_key.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)this;
    while( true ) {
      this_00 = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)
                (bVar7.tagged_ptr & 0xfffffffffffffff8);
      if ((bVar7.tagged_ptr & 7) == 0) break;
      bVar3 = detail::
              key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                        *)this_00);
      leaf_1._0_4_ = detail::
                     key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                     ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                          *)this_00,(uint64_t)k_local.field_0);
      if ((uint)leaf_1 < bVar3) {
        k_00 = &new_leaf._M_t.
                super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
        ;
        v_01._M_extent._M_extent_value = (size_t)local_80;
        v_01._M_ptr = (pointer)leaf._M_t.
                               super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               .
                               super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
                               ._M_head_impl;
        detail::
        make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db>
                  ((art_key_type)k_00,v_01,
                   (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                   v_local._M_ptr);
        detail::
        basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
        ::
        make_db_inode_unique_ptr<unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::basic_node_ptr<unodb::detail::node_header>&,unsigned_int_const&,unodb::detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>>&,std::unique_ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>,unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>>
                  ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
                    *)&v_local._M_extent,this,
                   (basic_node_ptr<unodb::detail::node_header> *)remaining_key.field_0,
                   (uint *)&leaf_1,
                   (tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)((long)&node + 4),
                   (unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    *)k_00);
        _Var2 = new_leaf._M_t.
                super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                .
                super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ;
        new_leaf._M_t.
        super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
        ._M_head_impl.db =
             (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
              )(basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                )0x0;
        uVar5 = detail::basic_node_ptr<unodb::detail::node_header>::tag_ptr
                          ((node_header *)
                           _Var2.
                           super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                           ._M_head_impl.db,I4);
        *(uintptr_t *)remaining_key.field_0 = uVar5;
        account_growing_inode<(unodb::node_type)1>(this);
        uVar1 = (this->growing_inode_counts)._M_elems[0];
        uVar6 = this->key_prefix_splits + 1;
        this->key_prefix_splits = uVar6;
        if (uVar1 <= uVar6) {
          __assert_fail("growing_inode_counts[internal_as_i<node_type::I4>] > key_prefix_splits",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                        ,0x3d0,
                        "bool unodb::db<unsigned long, std::span<const std::byte>>::insert_internal(art_key_type, value_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                       );
        }
        std::
        unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ::~unique_ptr((unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       *)&v_local._M_extent);
        goto LAB_0015d004;
      }
      if ((uint)leaf_1 != bVar3) {
        __assert_fail("shared_prefix_len == key_prefix_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                      ,0x3d6,
                      "bool unodb::db<unsigned long, std::span<const std::byte>>::insert_internal(art_key_type, value_type) [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      node._4_4_ = node._4_4_ + (uint)leaf_1;
      detail::basic_art_key<unsigned_long>::shift_right(&k_local,(ulong)bVar3);
      new_leaf._M_t.
      super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
      ._M_head_impl._0_1_ = k_local.field_0.key_bytes._M_elems[0];
      remaining_key.field_0 =
           (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)
           detail::
           basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
           ::
           add_or_choose_subtree<unodb::detail::basic_node_ptr<unodb::detail::node_header>*,std::byte,unodb::detail::basic_art_key<unsigned_long>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>>&,unodb::detail::basic_node_ptr<unodb::detail::node_header>*&>
                     ((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
                       *)this_00,(node_type)bVar7.tagged_ptr & (I256|I48),
                      (byte *)&new_leaf._M_t.
                               super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               .
                               super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
                      ,(basic_art_key<unsigned_long> *)
                       &leaf._M_t.
                        super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        .
                        super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
                      ,(span<const_std::byte,_18446744073709551615UL> *)local_80,this,
                      (tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)((long)&node + 4),
                      (basic_node_ptr<unodb::detail::node_header> **)&remaining_key);
      if (remaining_key.field_0.key ==
          (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)0x0) goto LAB_0015d009;
      k_local.field_0 =
           (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)((ulong)k_local.field_0 >> 8)
      ;
      node._4_4_ = node._4_4_ + 1;
      bVar7.tagged_ptr = *(uintptr_t *)remaining_key.field_0;
    }
    leaf._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db._4_4_ = 0;
    leaf._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db._0_4_ = this_00->key_size;
    new_leaf._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
    ._M_head_impl = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)this_00->data;
    local_98 = this_00;
    iVar4 = detail::basic_art_key<unsigned_long>::cmp
                      ((basic_art_key<unsigned_long> *)
                       &leaf._M_t.
                        super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        .
                        super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
                       ,new_leaf._M_t.
                        super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                        .
                        super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
                        ._M_head_impl,
                       (void *)leaf._M_t.
                               super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               .
                               super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               .
                               super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                               ._M_head_impl.db);
    bVar8 = iVar4 != 0;
    if (bVar8) {
      v_00._M_extent._M_extent_value = (size_t)local_80;
      v_00._M_ptr = (pointer)leaf._M_t.
                             super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             .
                             super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
                             ._M_head_impl;
      detail::
      make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db>
                ((art_key_type)&v_local._M_extent,v_00,
                 (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
                 v_local._M_ptr);
      detail::
      basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
      ::
      make_db_inode_unique_ptr<unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,std::span<std::byte_const,18446744073709551615ul>const&,unodb::detail::basic_art_key<unsigned_long>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<unsigned_long>>&,unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*const&,std::unique_ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>,unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>>
                ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
                  *)&leaf_1,this,
                 (span<const_std::byte,_18446744073709551615UL> *)
                 &new_leaf._M_t.
                  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  .
                  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
                 ,&k_local,
                 (tree_depth<unodb::detail::basic_art_key<unsigned_long>_> *)((long)&node + 4),
                 &local_98,
                 (unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                  *)&v_local._M_extent);
      ptr_._M_head_impl = _shared_prefix_len;
      _shared_prefix_len =
           (inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0;
      uVar5 = detail::basic_node_ptr<unodb::detail::node_header>::tag_ptr
                        ((node_header *)ptr_._M_head_impl,I4);
      *(uintptr_t *)remaining_key.field_0 = uVar5;
      account_growing_inode<(unodb::node_type)1>(this);
      std::
      unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)&leaf_1);
      std::
      unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                     *)&v_local._M_extent);
    }
  }
  return bVar8;
}

Assistant:

bool db<Key, Value>::insert_internal(art_key_type k, value_type v) {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) {
    auto leaf = art_policy::make_db_leaf_ptr(k, v, *this);
    root = detail::node_ptr{leaf.release(), node_type::LEAF};
    return true;
  }

  auto* node = &root;
  tree_depth_type depth{};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node->type();
    if (node_type == node_type::LEAF) {
      auto* const leaf{node->template ptr<leaf_type*>()};
      const auto existing_key{leaf->get_key_view()};
      const auto cmp = k.cmp(existing_key);
      if (UNODB_DETAIL_UNLIKELY(cmp == 0)) {
        return false;  // exists
      }
      // Replace the existing leaf with a new N4 and put the existing
      // leaf and the leaf for the caller's key and value under the
      // new inode as its direct children.
      auto new_leaf = art_policy::make_db_leaf_ptr(k, v, *this);
      auto new_node{inode_4::create(*this, existing_key, remaining_key, depth,
                                    leaf, std::move(new_leaf))};
      *node = detail::node_ptr{new_node.release(), node_type::I4};
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node->template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_len{key_prefix.get_shared_length(remaining_key)};
    if (shared_prefix_len < key_prefix_length) {
      // We have reached an existing inode whose key_prefix is greater
      // than the desired match.  We need to split this inode into a
      // new N4 whose children are the existing inode and a new child
      // leaf.
      auto leaf = art_policy::make_db_leaf_ptr(k, v, *this);
      auto new_node = inode_4::create(*this, *node, shared_prefix_len, depth,
                                      std::move(leaf));
      *node = detail::node_ptr{new_node.release(), node_type::I4};
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
      ++key_prefix_splits;
      UNODB_DETAIL_ASSERT(growing_inode_counts[internal_as_i<node_type::I4>] >
                          key_prefix_splits);
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }
    // key_prefix bytes were absorbed during the descent.  Now we need
    // to either descend along an existing child or create a new child.
    UNODB_DETAIL_ASSERT(shared_prefix_len == key_prefix_length);
    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    node = inode->template add_or_choose_subtree<detail::node_ptr*>(
        node_type, remaining_key[0], k, v, *this, depth, node);

    if (node == nullptr) return true;

    ++depth;
    remaining_key.shift_right(1);
  }
}